

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arbitrary.h
# Opt level: O2

pair<std::array<ArbitraryTestsFixtures::UserDefinedType,_2UL>,_std::vector<ArbitraryTestsFixtures::UserDefinedType,_std::allocator<ArbitraryTestsFixtures::UserDefinedType>_>_>
* cppqc::detail::
  ArbitraryPair<std::pair<std::array<ArbitraryTestsFixtures::UserDefinedType,_2UL>,_std::vector<ArbitraryTestsFixtures::UserDefinedType,_std::allocator<ArbitraryTestsFixtures::UserDefinedType>_>_>_>
  ::unGen(pair<std::array<ArbitraryTestsFixtures::UserDefinedType,_2UL>,_std::vector<ArbitraryTestsFixtures::UserDefinedType,_std::allocator<ArbitraryTestsFixtures::UserDefinedType>_>_>
          *__return_storage_ptr__,RngEngine *rng,size_t size)

{
  vector<ArbitraryTestsFixtures::UserDefinedType,_std::allocator<ArbitraryTestsFixtures::UserDefinedType>_>
  local_70;
  array<ArbitraryTestsFixtures::UserDefinedType,_2UL> local_58;
  
  ArbitraryImpl<std::array<ArbitraryTestsFixtures::UserDefinedType,_2UL>_>::unGen
            (&local_58,rng,size);
  ArbitraryImpl<std::vector<ArbitraryTestsFixtures::UserDefinedType,_std::allocator<ArbitraryTestsFixtures::UserDefinedType>_>_>
  ::unGen(&local_70,rng,size);
  std::
  pair<std::array<ArbitraryTestsFixtures::UserDefinedType,_2UL>,_std::vector<ArbitraryTestsFixtures::UserDefinedType,_std::allocator<ArbitraryTestsFixtures::UserDefinedType>_>_>
  ::
  pair<std::array<ArbitraryTestsFixtures::UserDefinedType,_2UL>,_std::vector<ArbitraryTestsFixtures::UserDefinedType,_std::allocator<ArbitraryTestsFixtures::UserDefinedType>_>,_true>
            (__return_storage_ptr__,&local_58,&local_70);
  std::
  vector<ArbitraryTestsFixtures::UserDefinedType,_std::allocator<ArbitraryTestsFixtures::UserDefinedType>_>
  ::~vector(&local_70);
  std::array<ArbitraryTestsFixtures::UserDefinedType,_2UL>::~array(&local_58);
  return __return_storage_ptr__;
}

Assistant:

static PairType unGen(RngEngine& rng, std::size_t size) {
    return PairType(
        Arbitrary<typename PairType::first_type>::unGen(rng, size),
        Arbitrary<typename PairType::second_type>::unGen(rng, size));
  }